

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  InternalMetadata *pIVar6;
  long *plVar7;
  undefined1 *puVar8;
  long lVar9;
  size_type *psVar10;
  long lVar11;
  Result *_result;
  uint uVar12;
  string err;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,-1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar5) {
      validateOutputCount(__return_storage_ptr__,layer,1,-1);
      bVar5 = Result::good(__return_storage_ptr__);
      if (bVar5) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar5) {
          if (layer->_oneof_case_[0] == 500) {
            puVar8 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar8 = Specification::_CustomLayerParams_default_instance_;
          }
          if (*(long *)(((ulong)((GRULayerParams *)puVar8)->updategatebiasvector_ &
                        0xfffffffffffffffe) + 8) == 0) {
            std::operator+(&local_40,"Custom layer ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_60.field_2._M_allocated_capacity = *psVar10;
              local_60.field_2._8_8_ = plVar7[3];
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar10;
              local_60._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_60._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pIVar6 = &(((BatchnormLayerParams *)puVar8)->mean_->super_MessageLite).
                      _internal_metadata_;
            if (((BatchnormLayerParams *)puVar8)->mean_ == (WeightParams *)0x0) {
              pIVar6 = (InternalMetadata *)0x0;
            }
            lVar9 = (long)*(int *)&(((ConvolutionLayerParams *)puVar8)->kernelsize_).
                                   arena_or_elements_;
            bVar5 = lVar9 == 0;
            if (!bVar5) {
              lVar11 = 0;
              do {
                lVar3 = *(long *)((long)&pIVar6->ptr_ + lVar11);
                bVar4 = 0 < *(int *)(lVar3 + 0x10);
                uVar12 = bVar4 + 1;
                if (*(long *)((*(ulong *)(lVar3 + 0x20) & 0xfffffffffffffffe) + 8) == 0) {
                  uVar12 = (uint)bVar4;
                }
                if (((uVar12 - (*(long *)((*(ulong *)(lVar3 + 0x28) & 0xfffffffffffffffe) + 8) == 0)
                     ) + 2) - (uint)(*(long *)((*(ulong *)(lVar3 + 0x30) & 0xfffffffffffffffe) + 8)
                                    == 0) != 1) {
                  std::operator+(&local_40,"Custom layer ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
                  psVar10 = (size_type *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar10) {
                    local_60.field_2._M_allocated_capacity = *psVar10;
                    local_60.field_2._8_8_ = plVar7[3];
                    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  }
                  else {
                    local_60.field_2._M_allocated_capacity = *psVar10;
                    local_60._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_60._M_string_length = plVar7[1];
                  *plVar7 = (long)psVar10;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_40._M_dataplus._M_p != &local_40.field_2) {
                    operator_delete(local_40._M_dataplus._M_p,
                                    local_40.field_2._M_allocated_capacity + 1);
                  }
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar5) {
                    return __return_storage_ptr__;
                  }
                  break;
                }
                lVar11 = lVar11 + 8;
                bVar5 = lVar9 * 8 == lVar11;
              } while (!bVar5);
            }
            Result::Result(__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, -1));

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}